

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O2

int __thiscall ON_ClippingRegion::IsVisible(ON_ClippingRegion *this,int count,ON_4dPoint *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  double *pdVar9;
  uint uVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  uVar8 = 0;
  uVar7 = 0xffffffff;
  do {
    bVar11 = count == 0;
    count = count + -1;
    if (bVar11) {
      if (uVar7 == 0) {
        return (uVar8 == 0) + 1;
      }
      return 0;
    }
    dVar12 = p->x;
    dVar1 = p->y;
    dVar2 = p->z;
    dVar3 = p->w;
    uVar6 = 0;
    if (this->m_clip_plane_count != 0) {
      uVar4 = 0x40;
      pdVar9 = (double *)&this->field_0x110;
      iVar5 = this->m_clip_plane_count;
      while (bVar11 = iVar5 != 0, iVar5 = iVar5 + -1, bVar11) {
        uVar10 = uVar4;
        if (-this->m_clip_plane_tolerance <=
            pdVar9[3] * dVar3 + pdVar9[2] * dVar2 + *pdVar9 * dVar12 + pdVar9[1] * dVar1) {
          uVar10 = 0;
        }
        uVar6 = uVar6 | uVar10;
        uVar4 = uVar4 * 2;
        pdVar9 = pdVar9 + 4;
      }
    }
    dVar13 = (this->m_xform).m_xform[3][3] * dVar3 +
             (this->m_xform).m_xform[3][2] * dVar2 +
             (this->m_xform).m_xform[3][0] * dVar12 + (this->m_xform).m_xform[3][1] * dVar1;
    dVar15 = (this->m_xform).m_xform[0][3] * dVar3 +
             (this->m_xform).m_xform[0][2] * dVar2 +
             (this->m_xform).m_xform[0][0] * dVar12 + dVar1 * (this->m_xform).m_xform[0][1];
    dVar14 = -dVar13;
    if (dVar14 <= dVar15) {
      if (dVar13 < dVar15) {
        uVar6 = uVar6 | 2;
      }
    }
    else {
      uVar6 = uVar6 | 1;
    }
    dVar15 = (this->m_xform).m_xform[1][3] * dVar3 +
             (this->m_xform).m_xform[1][2] * dVar2 +
             (this->m_xform).m_xform[1][0] * dVar12 + dVar1 * (this->m_xform).m_xform[1][1];
    if (dVar14 <= dVar15) {
      if (dVar13 < dVar15) {
        uVar6 = uVar6 | 8;
      }
    }
    else {
      uVar6 = uVar6 | 4;
    }
    dVar12 = dVar3 * (this->m_xform).m_xform[2][3] +
             dVar2 * (this->m_xform).m_xform[2][2] +
             dVar12 * (this->m_xform).m_xform[2][0] + dVar1 * (this->m_xform).m_xform[2][1];
    if (dVar14 <= dVar12) {
      if (dVar13 < dVar12) {
        uVar6 = uVar6 | 0x20;
      }
    }
    else {
      uVar6 = uVar6 | 0x10;
    }
    uVar8 = uVar8 | uVar6;
    uVar7 = uVar7 & uVar6;
    p = p + 1;
  } while (uVar7 != 0 || uVar8 == 0);
  return 1;
}

Assistant:

int ON_ClippingRegion::IsVisible( int count, const ON_4dPoint* p ) const
{
  const double* xform;
  const ON_PlaneEquation* cpeqn;
  const double* cv;
  double x, w;
  unsigned int out, all_out, some_out, cpbit;
  int i, j;

  // 14 May 2012 Dale Lear
  //   Fix http://dev.mcneel.com/bugtrack/?q=102481
  //   Picking hatches that are coplanar with clipping planes.
  //   The "fix" was to set clipping_plane_tolerance = same
  //   tolerance the display code uses.  Before the fix,
  //   0.0 was used as the clipping_plane_tolerance.
  const double clip_plane_tolerance = ClipPlaneTolerance();

  some_out = 0;
  all_out  = 0xFFFFFFFF;
  xform = &m_xform.m_xform[0][0];
  cv = &p[0].x;
  for ( i = count; i--; cv += 4 )
  {
    out = 0;
    if ( m_clip_plane_count )
    {
      cpbit = 0x40;
      cpeqn = m_clip_plane;
      j = m_clip_plane_count;
      while (j--)
      {
        x = cpeqn->x*cv[0] + cpeqn->y*cv[1] + cpeqn->z*cv[2] + cpeqn->d*cv[3];
        if ( x < -clip_plane_tolerance )
          out |= cpbit;
        cpbit <<= 1;
        cpeqn++;
      }
    }
    w = xform[12]*cv[0] + xform[13]*cv[1] + xform[14]*cv[2] + xform[15]*cv[3];
    x = xform[0]*cv[0] + xform[1]*cv[1] + xform[2]*cv[2] + xform[3]*cv[3];
    if (x < -w) out |= 0x01; else if (x > w) out |= 0x02;
    x = xform[4]*cv[0] + xform[5]*cv[1] + xform[6]*cv[2] + xform[7]*cv[3];
    if (x < -w) out |= 0x04; else if (x > w) out |= 0x08;
    x = xform[8]*cv[0] + xform[9]*cv[1] + xform[10]*cv[2] + xform[11]*cv[3];
    if (x < -w) out |= 0x10; else if (x > w) out |= 0x20;
    some_out |= out;
    all_out  &= out;
    if ( some_out && !all_out )
    {
      //  no further "out" checking is necessary
      break;
    }
  }

  if ( all_out )
    i = 0;
  else if ( some_out )
    i = 1;
  else
    i = 2;

  return i;
}